

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_BrowsePathResult *
UA_Server_translateBrowsePathToNodeIds
          (UA_BrowsePathResult *__return_storage_ptr__,UA_Server *server,UA_BrowsePath *browsePath)

{
  UA_BrowsePathResult *in_RCX;
  
  *(undefined8 *)__return_storage_ptr__ = 0;
  __return_storage_ptr__->targetsSize = 0;
  __return_storage_ptr__->targets = (UA_BrowsePathTarget *)0x0;
  translateBrowsePathToNodeIds
            (server,(UA_Session *)browsePath,(UA_BrowsePath *)__return_storage_ptr__,in_RCX);
  return __return_storage_ptr__;
}

Assistant:

UA_BrowsePathResult
UA_Server_translateBrowsePathToNodeIds(UA_Server *server,
                                       const UA_BrowsePath *browsePath) {
    UA_BrowsePathResult result;
    UA_BrowsePathResult_init(&result);
    UA_RCU_LOCK();
    translateBrowsePathToNodeIds(server, &adminSession, browsePath, &result);
    UA_RCU_UNLOCK();
    return result;
}